

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

Vec_Int_t * Abc_NtkGetNodeAttributes2(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *vAttrs_00;
  Abc_Obj_t *pObj_00;
  int local_24;
  int nSize;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vAttrs;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    vAttrs_00 = Vec_IntStart(iVar1 + 1);
    for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pObj_00 = Abc_NtkObj(pNtk,local_24);
      if ((((pObj_00 != (Abc_Obj_t *)0x0) && (pObj_00->Id != 0)) &&
          (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
         ((iVar1 = Abc_ObjFanoutNum(pObj_00), 1 < iVar1 &&
          (iVar1 = Abc_NodeIsMuxControlType(pObj_00), iVar1 == 0)))) {
        Abc_NtkIncrementTravId(pNtk);
        iVar1 = Abc_NtkSubDagSize_rec(pObj_00,vAttrs_00);
        if (0xf < iVar1) {
          Vec_IntWriteEntry(vAttrs_00,pObj_00->Id,1);
        }
      }
    }
    return vAttrs_00;
  }
  __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                ,0x2a6,"Vec_Int_t *Abc_NtkGetNodeAttributes2(Abc_Ntk_t *)");
}

Assistant:

Vec_Int_t * Abc_NtkGetNodeAttributes2( Abc_Ntk_t * pNtk ) 
{
    Vec_Int_t * vAttrs;
    Abc_Obj_t * pObj;
    int i, nSize;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    vAttrs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // skip no-nodes and nodes without fanouts
        if ( pObj->Id == 0 || !(Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
            continue;
        // the node has more than one fanout - count its sub-DAG size
        Abc_NtkIncrementTravId( pNtk );
        nSize = Abc_NtkSubDagSize_rec( pObj, vAttrs );
        if ( nSize > 15 )
            Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );
    }
    return vAttrs; 
}